

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_oct(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  uint uVar1;
  basic_format_specs<char> *specs;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *__dest;
  byte *pbVar6;
  ulong uVar7;
  ptrdiff_t _Num;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *pbVar14;
  write_int_data<char> local_40;
  
  uVar5 = (ulong)this->abs_value;
  uVar7 = *(ulong *)((long)&this->abs_value + 8);
  lVar11 = 0;
  uVar8 = uVar7;
  uVar9 = uVar5;
  do {
    uVar3 = uVar8 << 0x3d;
    lVar11 = lVar11 + 1;
    bVar12 = 7 < uVar9;
    bVar13 = uVar8 != 0;
    uVar4 = -uVar8;
    uVar8 = uVar8 >> 3;
    uVar9 = uVar3 | uVar9 >> 3;
  } while (bVar13 || uVar4 < bVar12);
  specs = this->specs;
  if (((char)specs->field_0x9 < '\0') &&
     ((uVar5 != 0 || uVar7 != 0) && specs->precision <= (int)lVar11)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  pbVar14 = (this->out).container;
  uVar7 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar11,prefix,specs);
  uVar5 = (ulong)specs->width;
  if (-1 < (long)uVar5) {
    uVar8 = 0;
    if (local_40.size <= uVar5) {
      uVar8 = uVar5 - local_40.size;
    }
    uVar5 = uVar8 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = pbVar14->size_;
    uVar9 = local_40.size + sVar2 + (specs->fill).size_ * uVar8;
    if (pbVar14->capacity_ < uVar9) {
      (**pbVar14->_vptr_buffer)(pbVar14,uVar9);
    }
    pbVar14->size_ = uVar9;
    __dest = fill<char*,char>(pbVar14->ptr_ + sVar2,uVar5,&specs->fill);
    if (uVar7 != 0) {
      memmove(__dest,this->prefix,uVar7);
      __dest = __dest + uVar7;
    }
    pcVar10 = __dest;
    if (local_40.padding != 0) {
      pcVar10 = __dest + local_40.padding;
      memset(__dest,0x30,local_40.padding);
    }
    pbVar6 = (byte *)(pcVar10 + lVar11);
    uVar7 = (ulong)this->abs_value;
    uVar9 = *(ulong *)((long)&this->abs_value + 8);
    do {
      pbVar6 = pbVar6 + -1;
      *pbVar6 = (byte)uVar7 & 7 | 0x30;
      bVar12 = 7 < uVar7;
      bVar13 = uVar9 != 0;
      uVar3 = -uVar9;
      uVar7 = uVar9 << 0x3d | uVar7 >> 3;
      uVar9 = uVar9 >> 3;
    } while (bVar13 || uVar3 < bVar12);
    fill<char*,char>(pcVar10 + lVar11,uVar8 - uVar5,&specs->fill);
    (this->out).container = pbVar14;
    return;
  }
  assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }